

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::XmlUnitTestResultPrinter::OnTestIterationEnd
          (XmlUnitTestResultPrinter *this,UnitTest *unit_test,int param_2)

{
  FILE *__stream;
  undefined8 uVar1;
  ostream *local_1d8;
  string local_1d0;
  stringstream local_1b0 [8];
  stringstream stream;
  ostream aoStack_1a0 [376];
  FILE *local_28;
  FILE *xmlout;
  UnitTest *pUStack_18;
  int param_2_local;
  UnitTest *unit_test_local;
  XmlUnitTestResultPrinter *this_local;
  
  xmlout._4_4_ = param_2;
  pUStack_18 = unit_test;
  unit_test_local = (UnitTest *)this;
  local_28 = (FILE *)OpenFileForWriting(&this->output_file_);
  std::__cxx11::stringstream::stringstream(local_1b0);
  local_1d8 = (ostream *)0x0;
  if (&stack0x00000000 != (undefined1 *)0x1b0) {
    local_1d8 = aoStack_1a0;
  }
  PrintXmlUnitTest(local_1d8,pUStack_18);
  __stream = local_28;
  StringStreamToString(&local_1d0,(stringstream *)local_1b0);
  uVar1 = std::__cxx11::string::c_str();
  fprintf(__stream,"%s",uVar1);
  std::__cxx11::string::~string((string *)&local_1d0);
  fclose(local_28);
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OnTestIterationEnd(const UnitTest& unit_test,
                                                  int /*iteration*/) {
  FILE* xmlout = OpenFileForWriting(output_file_);
  std::stringstream stream;
  PrintXmlUnitTest(&stream, unit_test);
  fprintf(xmlout, "%s", StringStreamToString(&stream).c_str());
  fclose(xmlout);
}